

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O1

bool __thiscall cmCTestGIT::UpdateByCustom(cmCTestGIT *this,string *custom)

{
  bool bVar1;
  pointer pbVar2;
  vector<const_char_*,_std::allocator<const_char_*>_> git_custom;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_custom_command;
  OutputLogger custom_out;
  OutputLogger custom_err;
  char **local_d8;
  iterator iStack_d0;
  char **local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  OutputLogger local_a0;
  OutputLogger local_60;
  
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmSystemTools::ExpandListArgument(custom,&local_b8,true);
  local_d8 = (char **)0x0;
  iStack_d0._M_current = (char **)0x0;
  local_c8 = (char **)0x0;
  if (local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar2 = local_b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_a0.super_LineParser.super_OutputParser._vptr_OutputParser =
           (_func_int **)(pbVar2->_M_dataplus)._M_p;
      if (iStack_d0._M_current == local_c8) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_d8,iStack_d0,
                   (char **)&local_a0);
      }
      else {
        *iStack_d0._M_current =
             (char *)local_a0.super_LineParser.super_OutputParser._vptr_OutputParser;
        iStack_d0._M_current = iStack_d0._M_current + 1;
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != local_b8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_a0.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x0;
  if (iStack_d0._M_current == local_c8) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_d8,iStack_d0,
               (char **)&local_a0);
  }
  else {
    *iStack_d0._M_current = (char *)0x0;
    iStack_d0._M_current = iStack_d0._M_current + 1;
  }
  cmProcessTools::OutputLogger::OutputLogger
            (&local_a0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"custom-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_60,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"custom-err> ");
  bVar1 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,local_d8,(OutputParser *)&local_a0,(OutputParser *)&local_60)
  ;
  local_60.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_006d5530;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.super_LineParser.Line._M_dataplus._M_p != &local_60.super_LineParser.Line.field_2)
  {
    operator_delete(local_60.super_LineParser.Line._M_dataplus._M_p,
                    local_60.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_a0.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_006d5530;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.super_LineParser.Line._M_dataplus._M_p != &local_a0.super_LineParser.Line.field_2)
  {
    operator_delete(local_a0.super_LineParser.Line._M_dataplus._M_p,
                    local_a0.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != (char **)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return bVar1;
}

Assistant:

bool cmCTestGIT::UpdateByCustom(std::string const& custom)
{
  std::vector<std::string> git_custom_command;
  cmSystemTools::ExpandListArgument(custom, git_custom_command, true);
  std::vector<char const*> git_custom;
  for(std::vector<std::string>::const_iterator
        i = git_custom_command.begin(); i != git_custom_command.end(); ++i)
    {
    git_custom.push_back(i->c_str());
    }
  git_custom.push_back(0);

  OutputLogger custom_out(this->Log, "custom-out> ");
  OutputLogger custom_err(this->Log, "custom-err> ");
  return this->RunUpdateCommand(&git_custom[0], &custom_out, &custom_err);
}